

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::visibility_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,e_struct_type struct_type)

{
  allocator local_2d [16];
  allocator local_1d;
  e_struct_type local_1c;
  t_rs_generator *ptStack_18;
  e_struct_type struct_type_local;
  t_rs_generator *this_local;
  
  local_1c = struct_type;
  ptStack_18 = this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  if (struct_type == T_ARGS || struct_type == T_RESULT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"pub ",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::visibility_qualifier(t_rs_generator::e_struct_type struct_type) {
  switch(struct_type) {
  case t_rs_generator::T_ARGS:
  case t_rs_generator::T_RESULT:
    return "";
  default:
    return "pub ";
  }
}